

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

unique_ptr<perfetto::ipc::Host,_std::default_delete<perfetto::ipc::Host>_> __thiscall
perfetto::ipc::Host::CreateInstance(Host *this,char *socket_name,TaskRunner *task_runner)

{
  UnixSocket *pUVar1;
  HostImpl *this_00;
  
  this_00 = (HostImpl *)operator_new(0xd0);
  HostImpl::HostImpl(this_00,socket_name,task_runner);
  pUVar1 = (this_00->sock_)._M_t.
           super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
           ._M_t.
           super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
           .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl;
  if ((pUVar1 == (UnixSocket *)0x0) || (pUVar1->state_ != kListening)) {
    this->_vptr_Host = (_func_int **)0x0;
    (*(this_00->super_Host)._vptr_Host[1])(this_00);
  }
  else {
    this->_vptr_Host = (_func_int **)this_00;
  }
  return (__uniq_ptr_data<perfetto::ipc::Host,_std::default_delete<perfetto::ipc::Host>,_true,_true>
         )(__uniq_ptr_data<perfetto::ipc::Host,_std::default_delete<perfetto::ipc::Host>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<Host> Host::CreateInstance(const char* socket_name,
                                           base::TaskRunner* task_runner) {
  std::unique_ptr<HostImpl> host(new HostImpl(socket_name, task_runner));
  if (!host->sock() || !host->sock()->is_listening())
    return nullptr;
  return std::unique_ptr<Host>(std::move(host));
}